

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int matchshreg(match *res,reg *reg,expr *expr,int shl,disctx *ctx)

{
  int iVar1;
  int in_ECX;
  int *in_RDX;
  ull num_1;
  ull num;
  ull sh;
  ulong local_48;
  ulong local_40;
  long local_38;
  int *local_20;
  
  local_38 = 0;
  local_20 = in_RDX;
  while( true ) {
    while( true ) {
      for (; (*local_20 == 0xe && (**(int **)(local_20 + 10) == 0));
          local_20 = *(int **)(local_20 + 8)) {
        local_38 = *(long *)(*(long *)(local_20 + 10) + 0x10) + local_38;
      }
      if ((*local_20 != 10) || (**(int **)(local_20 + 10) != 0)) break;
      local_40 = *(ulong *)(*(long *)(local_20 + 10) + 0x10);
      if ((local_40 == 0) || ((local_40 & local_40 - 1) != 0)) {
        return 0;
      }
      for (; local_40 != 1; local_40 = local_40 >> 1) {
        local_38 = local_38 + 1;
      }
      local_20 = *(int **)(local_20 + 8);
    }
    if ((*local_20 != 10) || (**(int **)(local_20 + 8) != 0)) break;
    local_48 = *(ulong *)(*(long *)(local_20 + 8) + 0x10);
    if ((local_48 == 0) || ((local_48 & local_48 - 1) != 0)) {
      return 0;
    }
    for (; local_48 != 1; local_48 = local_48 >> 1) {
      local_38 = local_38 + 1;
    }
    local_20 = *(int **)(local_20 + 10);
  }
  if (local_38 != in_ECX) {
    return 0;
  }
  iVar1 = matchreg((match *)ctx,(reg *)sh,(expr *)num,(disctx *)num_1);
  return iVar1;
}

Assistant:

int matchshreg (struct match *res, const struct reg *reg, const struct expr *expr, int shl, struct disctx *ctx) {
	ull sh = 0;
	while (1) {
		if (expr->type == EXPR_SHL && expr->expr2->type == EXPR_NUM) {
			sh += expr->expr2->num1;
			expr = expr->expr1;
		} else if (expr->type == EXPR_MUL && expr->expr2->type == EXPR_NUM) {
			ull num = expr->expr2->num1;
			if (!num || (num & (num-1)))
				return 0;
			while (num != 1)
				num >>= 1, sh++;
			expr = expr->expr1;
		} else if (expr->type == EXPR_MUL && expr->expr1->type == EXPR_NUM) {
			ull num = expr->expr1->num1;
			if (!num || (num & (num-1)))
				return 0;
			while (num != 1)
				num >>= 1, sh++;
			expr = expr->expr2;
		} else {
			break;
		}
	}
	if (sh != shl)
		return 0;
	return matchreg(res, reg, expr, ctx);
}